

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_sextract_i64_mipsel
               (TCGContext_conflict4 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg,uint ofs,uint len)

{
  int iVar1;
  uint len_local;
  uint ofs_local;
  TCGv_i64 arg_local;
  TCGv_i64 ret_local;
  TCGContext_conflict4 *tcg_ctx_local;
  
  if (ofs + len == 0x40) {
    tcg_gen_sari_i64_mipsel(tcg_ctx,ret,arg,(ulong)(0x40 - len));
    return;
  }
  if (ofs == 0) {
    if (len == 8) {
      tcg_gen_ext8s_i64_mipsel(tcg_ctx,ret,arg);
      return;
    }
    if (len == 0x10) {
      tcg_gen_ext16s_i64_mipsel(tcg_ctx,ret,arg);
      return;
    }
    if (len == 0x20) {
      tcg_gen_ext32s_i64_mipsel(tcg_ctx,ret,arg);
      return;
    }
  }
  iVar1 = ofs + len;
  if (iVar1 == 8) {
    tcg_gen_ext8s_i64_mipsel(tcg_ctx,ret,arg);
    tcg_gen_sari_i64_mipsel(tcg_ctx,ret,ret,(ulong)ofs);
  }
  else if (iVar1 == 0x10) {
    tcg_gen_ext16s_i64_mipsel(tcg_ctx,ret,arg);
    tcg_gen_sari_i64_mipsel(tcg_ctx,ret,ret,(ulong)ofs);
  }
  else if (iVar1 == 0x20) {
    tcg_gen_ext32s_i64_mipsel(tcg_ctx,ret,arg);
    tcg_gen_sari_i64_mipsel(tcg_ctx,ret,ret,(ulong)ofs);
  }
  else if (len == 8) {
    tcg_gen_shri_i64_mipsel(tcg_ctx,ret,arg,(ulong)ofs);
    tcg_gen_ext8s_i64_mipsel(tcg_ctx,ret,ret);
  }
  else if (len == 0x10) {
    tcg_gen_shri_i64_mipsel(tcg_ctx,ret,arg,(ulong)ofs);
    tcg_gen_ext16s_i64_mipsel(tcg_ctx,ret,ret);
  }
  else if (len == 0x20) {
    tcg_gen_shri_i64_mipsel(tcg_ctx,ret,arg,(ulong)ofs);
    tcg_gen_ext32s_i64_mipsel(tcg_ctx,ret,ret);
  }
  else {
    tcg_gen_shli_i64_mipsel(tcg_ctx,ret,arg,(ulong)((0x40 - len) - ofs));
    tcg_gen_sari_i64_mipsel(tcg_ctx,ret,ret,(ulong)(0x40 - len));
  }
  return;
}

Assistant:

void tcg_gen_sextract_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg,
                          unsigned int ofs, unsigned int len)
{
    tcg_debug_assert(ofs < 64);
    tcg_debug_assert(len > 0);
    tcg_debug_assert(len <= 64);
    tcg_debug_assert(ofs + len <= 64);

    /* Canonicalize certain special cases, even if sextract is supported.  */
    if (ofs + len == 64) {
        tcg_gen_sari_i64(tcg_ctx, ret, arg, 64 - len);
        return;
    }
    if (ofs == 0) {
        switch (len) {
        case 32:
            tcg_gen_ext32s_i64(tcg_ctx, ret, arg);
            return;
        case 16:
            tcg_gen_ext16s_i64(tcg_ctx, ret, arg);
            return;
        case 8:
            tcg_gen_ext8s_i64(tcg_ctx, ret, arg);
            return;
        }
    }

#if TCG_TARGET_REG_BITS == 32
        /* Look for a 32-bit extract within one of the two words.  */
        if (ofs >= 32) {
            tcg_gen_sextract_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg), ofs - 32, len);
        } else if (ofs + len <= 32) {
            tcg_gen_sextract_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg), ofs, len);
        } else if (ofs == 0) {
            tcg_gen_mov_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg));
            tcg_gen_sextract_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg), 0, len - 32);
            return;
        } else if (len > 32) {
            TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);
            /* Extract the bits for the high word normally.  */
            tcg_gen_sextract_i32(tcg_ctx, t, TCGV_HIGH(tcg_ctx, arg), ofs + 32, len - 32);
            /* Shift the field down for the low part.  */
            tcg_gen_shri_i64(tcg_ctx, ret, arg, ofs);
            /* Overwrite the shift into the high part.  */
            tcg_gen_mov_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), t);
            tcg_temp_free_i32(tcg_ctx, t);
            return;
        } else {
            /* Shift the field down for the low part, such that the
               field sits at the MSB.  */
            tcg_gen_shri_i64(tcg_ctx, ret, arg, ofs + len - 32);
            /* Shift the field down from the MSB, sign extending.  */
            tcg_gen_sari_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, ret), 32 - len);
        }
        /* Sign-extend the field from 32 bits.  */
        tcg_gen_sari_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_LOW(tcg_ctx, ret), 31);
        return;
#endif

#if TCG_TARGET_HAS_sextract_i64
    if (TCG_TARGET_extract_i64_valid(ofs, len)) {
        tcg_gen_op4ii_i64(tcg_ctx, INDEX_op_sextract_i64, ret, arg, ofs, len);
        return;
    }
#endif

    /* Assume that sign-extension, if available, is cheaper than a shift.  */
    switch (ofs + len) {
    case 32:
#if TCG_TARGET_HAS_ext32s_i64
            tcg_gen_ext32s_i64(tcg_ctx, ret, arg);
            tcg_gen_sari_i64(tcg_ctx, ret, ret, ofs);
            return;
#endif
        break;
    case 16:
#if TCG_TARGET_HAS_ext16s_i64
            tcg_gen_ext16s_i64(tcg_ctx, ret, arg);
            tcg_gen_sari_i64(tcg_ctx, ret, ret, ofs);
            return;
#endif
        break;
    case 8:
#if TCG_TARGET_HAS_ext8s_i64
            tcg_gen_ext8s_i64(tcg_ctx, ret, arg);
            tcg_gen_sari_i64(tcg_ctx, ret, ret, ofs);
            return;
#endif
        break;
    }
    switch (len) {
    case 32:
#if TCG_TARGET_HAS_ext32s_i64
            tcg_gen_shri_i64(tcg_ctx, ret, arg, ofs);
            tcg_gen_ext32s_i64(tcg_ctx, ret, ret);
            return;
#endif
        break;
    case 16:
#if TCG_TARGET_HAS_ext16s_i64
            tcg_gen_shri_i64(tcg_ctx, ret, arg, ofs);
            tcg_gen_ext16s_i64(tcg_ctx, ret, ret);
            return;
#endif
        break;
    case 8:
#if TCG_TARGET_HAS_ext8s_i64
            tcg_gen_shri_i64(tcg_ctx, ret, arg, ofs);
            tcg_gen_ext8s_i64(tcg_ctx, ret, ret);
            return;
#endif
        break;
    }
    tcg_gen_shli_i64(tcg_ctx, ret, arg, 64 - len - ofs);
    tcg_gen_sari_i64(tcg_ctx, ret, ret, 64 - len);
}